

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall
PPointer::SetPointer
          (PPointer *this,void *base,uint offset,TArray<unsigned_long,_unsigned_long> *special)

{
  uint uVar1;
  PType *pPVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  bool bVar6;
  
  pPVar3 = PClass::RegistrationInfo.MyClass;
  pPVar2 = this->PointedType;
  if (pPVar2 != (PType *)0x0) {
    if ((pPVar2->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
      (pPVar2->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
    }
    pPVar5 = (pPVar2->super_PTypeBase).super_DObject.Class;
    bVar6 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar6) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (bVar6) {
      TArray<unsigned_long,_unsigned_long>::Grow(special,1);
      uVar1 = special->Count;
      special->Array[uVar1] = (ulong)offset;
      special->Count = uVar1 + 1;
    }
  }
  return;
}

Assistant:

void PPointer::SetPointer(void *base, unsigned offset, TArray<size_t> *special) const
{
	if (PointedType != nullptr && PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
	{
		// Add to the list of pointers for this class.
		special->Push(offset);
	}
}